

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O0

PackageInfo * chatra::emb::math::packageInfo(void)

{
  allocator<chatra::Script> *this;
  initializer_list<chatra::NativeCallHandlerInfo> __l;
  initializer_list<chatra::Script> __l_00;
  undefined *puVar1;
  PackageInfo *in_RDI;
  NativeCallHandlerInfo *local_1f68;
  Script *local_1c50;
  allocator<chatra::NativeCallHandlerInfo> local_1c0b;
  undefined1 local_1c0a;
  allocator local_1c09;
  string local_1c08;
  allocator local_1be1;
  string local_1be0;
  allocator local_1bb9;
  string local_1bb8;
  allocator local_1b91;
  string local_1b90;
  allocator local_1b69;
  string local_1b68;
  allocator local_1b41;
  string local_1b40;
  allocator local_1b19;
  string local_1b18;
  allocator local_1af1;
  string local_1af0;
  allocator local_1ac9;
  string local_1ac8;
  allocator local_1aa1;
  string local_1aa0;
  allocator local_1a79;
  string local_1a78;
  allocator local_1a51;
  string local_1a50;
  allocator local_1a29;
  string local_1a28;
  allocator local_1a01;
  string local_1a00;
  allocator local_19d9;
  string local_19d8;
  allocator local_19b1;
  string local_19b0;
  allocator local_1989;
  string local_1988;
  allocator local_1961;
  string local_1960;
  allocator local_1939;
  string local_1938;
  allocator local_1911;
  string local_1910;
  allocator local_18e9;
  string local_18e8;
  allocator local_18c1;
  string local_18c0;
  allocator local_1899;
  string local_1898;
  allocator local_1871;
  string local_1870;
  allocator local_1849;
  string local_1848;
  allocator local_1821;
  string local_1820;
  allocator local_17f9;
  string local_17f8;
  allocator local_17d1;
  string local_17d0;
  allocator local_17a9;
  string local_17a8;
  allocator local_1781;
  string local_1780;
  allocator local_1759;
  string local_1758;
  allocator local_1731;
  string local_1730;
  allocator local_1709;
  string local_1708;
  allocator local_16e1;
  string local_16e0;
  allocator local_16b9;
  string local_16b8;
  allocator local_1691;
  string local_1690;
  allocator local_1669;
  string local_1668;
  allocator local_1641;
  string local_1640;
  allocator local_1619;
  string local_1618;
  allocator local_15f1;
  string local_15f0;
  allocator local_15c9;
  string local_15c8;
  allocator local_15a1;
  string local_15a0;
  allocator local_1579;
  string local_1578;
  allocator local_1551;
  string local_1550;
  allocator local_1529;
  string local_1528;
  allocator local_1501;
  string local_1500;
  allocator local_14d9;
  string local_14d8;
  allocator local_14b1;
  string local_14b0;
  NativeCallHandlerInfo *local_1490;
  NativeCallHandlerInfo local_1488;
  NativeCallHandlerInfo local_1420;
  NativeCallHandlerInfo local_13b8;
  NativeCallHandlerInfo local_1350;
  NativeCallHandlerInfo local_12e8;
  NativeCallHandlerInfo local_1280;
  NativeCallHandlerInfo local_1218;
  NativeCallHandlerInfo local_11b0;
  NativeCallHandlerInfo local_1148;
  NativeCallHandlerInfo local_10e0;
  NativeCallHandlerInfo local_1078;
  NativeCallHandlerInfo local_1010;
  NativeCallHandlerInfo local_fa8;
  NativeCallHandlerInfo local_f40;
  NativeCallHandlerInfo local_ed8;
  NativeCallHandlerInfo local_e70;
  NativeCallHandlerInfo local_e08;
  NativeCallHandlerInfo local_da0;
  NativeCallHandlerInfo local_d38;
  NativeCallHandlerInfo local_cd0;
  NativeCallHandlerInfo local_c68;
  NativeCallHandlerInfo local_c00;
  NativeCallHandlerInfo local_b98;
  NativeCallHandlerInfo local_b30;
  NativeCallHandlerInfo local_ac8;
  NativeCallHandlerInfo local_a60;
  NativeCallHandlerInfo local_9f8;
  NativeCallHandlerInfo local_990;
  NativeCallHandlerInfo local_928;
  NativeCallHandlerInfo local_8c0;
  NativeCallHandlerInfo local_858;
  NativeCallHandlerInfo local_7f0;
  NativeCallHandlerInfo local_788;
  NativeCallHandlerInfo local_720;
  NativeCallHandlerInfo local_6b8;
  NativeCallHandlerInfo local_650;
  NativeCallHandlerInfo local_5e8;
  NativeCallHandlerInfo local_580;
  NativeCallHandlerInfo local_518;
  NativeCallHandlerInfo local_4b0;
  NativeCallHandlerInfo local_448;
  NativeCallHandlerInfo local_3e0;
  NativeCallHandlerInfo local_378;
  NativeCallHandlerInfo local_310;
  NativeCallHandlerInfo local_2a8;
  NativeCallHandlerInfo local_240;
  NativeCallHandlerInfo local_1d8;
  NativeCallHandlerInfo local_170;
  undefined1 local_108 [24];
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  string local_d8;
  allocator local_a1;
  string local_a0;
  Script *local_80;
  Script local_78;
  Script *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"math",&local_a1);
  puVar1 = script;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,puVar1,
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Script::Script(&local_78,&local_a0,&local_d8);
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_30 = 1;
  this = (allocator<chatra::Script> *)
         ((long)&handlers.
                 super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  local_38 = &local_78;
  std::allocator<chatra::Script>::allocator(this);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28,__l_00,this);
  std::allocator<chatra::Script>::~allocator
            ((allocator<chatra::Script> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_1c50 = (Script *)&local_38;
  do {
    local_1c50 = local_1c50 + -1;
    Script::~Script(local_1c50);
  } while (local_1c50 != &local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_1c0a = 1;
  local_1490 = &local_1488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14b0,"sin",&local_14b1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1488,math_sin,&local_14b0);
  local_1490 = &local_1420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14d8,"cos",&local_14d9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1420,math_cos,&local_14d8);
  local_1490 = &local_13b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1500,"tan",&local_1501);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_13b8,math_tan,&local_1500);
  local_1490 = &local_1350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1528,"asin",&local_1529);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1350,math_asin,&local_1528);
  local_1490 = &local_12e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1550,"acos",&local_1551);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_12e8,math_acos,&local_1550);
  local_1490 = &local_1280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1578,"atan",&local_1579);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1280,math_atan,&local_1578);
  local_1490 = &local_1218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15a0,"atan2",&local_15a1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1218,math_atan2,&local_15a0);
  local_1490 = &local_11b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15c8,"sinh",&local_15c9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_11b0,math_sinh,&local_15c8);
  local_1490 = &local_1148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15f0,"cosh",&local_15f1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1148,math_cosh,&local_15f0);
  local_1490 = &local_10e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1618,"tanh",&local_1619);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_10e0,math_tanh,&local_1618);
  local_1490 = &local_1078;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1640,"asinh",&local_1641);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1078,math_asinh,&local_1640);
  local_1490 = &local_1010;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1668,"acosh",&local_1669);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1010,math_acosh,&local_1668);
  local_1490 = &local_fa8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1690,"atanh",&local_1691);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_fa8,math_atanh,&local_1690);
  local_1490 = &local_f40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16b8,"exp",&local_16b9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_f40,math_exp,&local_16b8);
  local_1490 = &local_ed8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16e0,"exp2",&local_16e1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_ed8,math_exp2,&local_16e0);
  local_1490 = &local_e70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1708,"expm1",&local_1709);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_e70,math_expm1,&local_1708);
  local_1490 = &local_e08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1730,"logn",&local_1731);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_e08,math_logn,&local_1730);
  local_1490 = &local_da0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1758,"log10",&local_1759);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_da0,math_log10,&local_1758);
  local_1490 = &local_d38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1780,"log1p",&local_1781);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_d38,math_log1p,&local_1780);
  local_1490 = &local_cd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17a8,"log2",&local_17a9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_cd0,math_log2,&local_17a8);
  local_1490 = &local_c68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17d0,"ldexp",&local_17d1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_c68,math_ldexp,&local_17d0);
  local_1490 = &local_c00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17f8,"_native_frexp_fraction",&local_17f9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_c00,math_frexp_fraction,&local_17f8);
  local_1490 = &local_b98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1820,"_native_frexp_exponent",&local_1821);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_b98,math_frexp_exponent,&local_1820);
  local_1490 = &local_b30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1848,"ilogb",&local_1849);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_b30,math_ilogb,&local_1848);
  local_1490 = &local_ac8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1870,"logb",&local_1871);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_ac8,math_logb,&local_1870);
  local_1490 = &local_a60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1898,"_native_modf_integral",&local_1899);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_a60,math_modf_integral,&local_1898);
  local_1490 = &local_9f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_18c0,"_native_modf_fractional",&local_18c1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_9f8,math_modf_fractional,&local_18c0);
  local_1490 = &local_990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_18e8,"pow",&local_18e9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_990,math_pow,&local_18e8);
  local_1490 = &local_928;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1910,"sqrt",&local_1911);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_928,math_sqrt,&local_1910);
  local_1490 = &local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1938,"cbrt",&local_1939);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_8c0,math_cbrt,&local_1938);
  local_1490 = &local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1960,"hypot",&local_1961);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_858,math_hypot,&local_1960);
  local_1490 = &local_7f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1988,"abs",&local_1989);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_7f0,math_abs,&local_1988);
  local_1490 = &local_788;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_19b0,"erf",&local_19b1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_788,math_erf,&local_19b0);
  local_1490 = &local_720;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_19d8,"erfc",&local_19d9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_720,math_erfc,&local_19d8);
  local_1490 = &local_6b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a00,"tgamma",&local_1a01);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_6b8,math_tgamma,&local_1a00);
  local_1490 = &local_650;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a28,"lgamma",&local_1a29);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_650,math_lgamma,&local_1a28);
  local_1490 = &local_5e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a50,"ceil",&local_1a51);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_5e8,math_ceil,&local_1a50);
  local_1490 = &local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a78,"floor",&local_1a79);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_580,math_floor,&local_1a78);
  local_1490 = &local_518;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1aa0,"trunc",&local_1aa1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_518,math_trunc,&local_1aa0);
  local_1490 = &local_4b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ac8,"round",&local_1ac9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_4b0,math_round,&local_1ac8);
  local_1490 = &local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1af0,"mod",&local_1af1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_448,math_mod,&local_1af0);
  local_1490 = &local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b18,"remainder",&local_1b19);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_3e0,math_remainder,&local_1b18);
  local_1490 = &local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b40,"nextafter",&local_1b41);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_378,math_nextafter,&local_1b40);
  local_1490 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b68,"isfinite",&local_1b69);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_310,math_isfinite,&local_1b68);
  local_1490 = &local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b90,"isinf",&local_1b91);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_2a8,math_isinf,&local_1b90);
  local_1490 = &local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1bb8,"isnan",&local_1bb9);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_240,math_isnan,&local_1bb8);
  local_1490 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1be0,"isnormal",&local_1be1);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_1d8,math_isnormal,&local_1be0);
  local_1490 = &local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c08,"signbit",&local_1c09);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_170,math_signbit,&local_1c08);
  local_1c0a = 0;
  local_108._0_8_ = &local_1488;
  local_108._8_8_ = 0x30;
  std::allocator<chatra::NativeCallHandlerInfo>::allocator(&local_1c0b);
  __l._M_len = local_108._8_8_;
  __l._M_array = (iterator)local_108._0_8_;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10),__l,&local_1c0b);
  std::allocator<chatra::NativeCallHandlerInfo>::~allocator(&local_1c0b);
  local_1f68 = (NativeCallHandlerInfo *)local_108;
  do {
    local_1f68 = local_1f68 + -1;
    NativeCallHandlerInfo::~NativeCallHandlerInfo(local_1f68);
  } while (local_1f68 != &local_1488);
  std::__cxx11::string::~string((string *)&local_1c08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c09);
  std::__cxx11::string::~string((string *)&local_1be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be1);
  std::__cxx11::string::~string((string *)&local_1bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb9);
  std::__cxx11::string::~string((string *)&local_1b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b91);
  std::__cxx11::string::~string((string *)&local_1b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b69);
  std::__cxx11::string::~string((string *)&local_1b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b41);
  std::__cxx11::string::~string((string *)&local_1b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b19);
  std::__cxx11::string::~string((string *)&local_1af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1af1);
  std::__cxx11::string::~string((string *)&local_1ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ac9);
  std::__cxx11::string::~string((string *)&local_1aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1aa1);
  std::__cxx11::string::~string((string *)&local_1a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a79);
  std::__cxx11::string::~string((string *)&local_1a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
  std::__cxx11::string::~string((string *)&local_1a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a29);
  std::__cxx11::string::~string((string *)&local_1a00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a01);
  std::__cxx11::string::~string((string *)&local_19d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19d9);
  std::__cxx11::string::~string((string *)&local_19b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19b1);
  std::__cxx11::string::~string((string *)&local_1988);
  std::allocator<char>::~allocator((allocator<char> *)&local_1989);
  std::__cxx11::string::~string((string *)&local_1960);
  std::allocator<char>::~allocator((allocator<char> *)&local_1961);
  std::__cxx11::string::~string((string *)&local_1938);
  std::allocator<char>::~allocator((allocator<char> *)&local_1939);
  std::__cxx11::string::~string((string *)&local_1910);
  std::allocator<char>::~allocator((allocator<char> *)&local_1911);
  std::__cxx11::string::~string((string *)&local_18e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18e9);
  std::__cxx11::string::~string((string *)&local_18c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18c1);
  std::__cxx11::string::~string((string *)&local_1898);
  std::allocator<char>::~allocator((allocator<char> *)&local_1899);
  std::__cxx11::string::~string((string *)&local_1870);
  std::allocator<char>::~allocator((allocator<char> *)&local_1871);
  std::__cxx11::string::~string((string *)&local_1848);
  std::allocator<char>::~allocator((allocator<char> *)&local_1849);
  std::__cxx11::string::~string((string *)&local_1820);
  std::allocator<char>::~allocator((allocator<char> *)&local_1821);
  std::__cxx11::string::~string((string *)&local_17f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f9);
  std::__cxx11::string::~string((string *)&local_17d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17d1);
  std::__cxx11::string::~string((string *)&local_17a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a9);
  std::__cxx11::string::~string((string *)&local_1780);
  std::allocator<char>::~allocator((allocator<char> *)&local_1781);
  std::__cxx11::string::~string((string *)&local_1758);
  std::allocator<char>::~allocator((allocator<char> *)&local_1759);
  std::__cxx11::string::~string((string *)&local_1730);
  std::allocator<char>::~allocator((allocator<char> *)&local_1731);
  std::__cxx11::string::~string((string *)&local_1708);
  std::allocator<char>::~allocator((allocator<char> *)&local_1709);
  std::__cxx11::string::~string((string *)&local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  std::__cxx11::string::~string((string *)&local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  std::__cxx11::string::~string((string *)&local_1690);
  std::allocator<char>::~allocator((allocator<char> *)&local_1691);
  std::__cxx11::string::~string((string *)&local_1668);
  std::allocator<char>::~allocator((allocator<char> *)&local_1669);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  std::__cxx11::string::~string((string *)&local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  std::__cxx11::string::~string((string *)&local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  std::__cxx11::string::~string((string *)&local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
  std::__cxx11::string::~string((string *)&local_1578);
  std::allocator<char>::~allocator((allocator<char> *)&local_1579);
  std::__cxx11::string::~string((string *)&local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  std::__cxx11::string::~string((string *)&local_1528);
  std::allocator<char>::~allocator((allocator<char> *)&local_1529);
  std::__cxx11::string::~string((string *)&local_1500);
  std::allocator<char>::~allocator((allocator<char> *)&local_1501);
  std::__cxx11::string::~string((string *)&local_14d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14d9);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)(local_108 + 0x10));
  std::shared_ptr<chatra::IPackage>::shared_ptr(&in_RDI->interface,(nullptr_t)0x0);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          (local_108 + 0x10));
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_28);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"math", script}};
	std::vector<HandlerInfo> handlers = {
			{math_sin, "sin"},
			{math_cos, "cos"},
			{math_tan, "tan"},
			{math_asin, "asin"},
			{math_acos, "acos"},
			{math_atan, "atan"},
			{math_atan2, "atan2"},

			{math_sinh, "sinh"},
			{math_cosh, "cosh"},
			{math_tanh, "tanh"},
			{math_asinh, "asinh"},
			{math_acosh, "acosh"},
			{math_atanh, "atanh"},

			{math_exp, "exp"},
			{math_exp2, "exp2"},
			{math_expm1, "expm1"},
			{math_logn, "logn"},
			{math_log10, "log10"},
			{math_log1p, "log1p"},
			{math_log2, "log2"},

			{math_ldexp, "ldexp"},
			{math_frexp_fraction, "_native_frexp_fraction"},
			{math_frexp_exponent, "_native_frexp_exponent"},
			{math_ilogb, "ilogb"},
			{math_logb, "logb"},
			{math_modf_integral, "_native_modf_integral"},
			{math_modf_fractional, "_native_modf_fractional"},

			{math_pow, "pow"},
			{math_sqrt, "sqrt"},
			{math_cbrt, "cbrt"},
			{math_hypot, "hypot"},
			{math_abs, "abs"},

			{math_erf, "erf"},
			{math_erfc, "erfc"},
			{math_tgamma, "tgamma"},
			{math_lgamma, "lgamma"},

			{math_ceil, "ceil"},
			{math_floor, "floor"},
			{math_trunc, "trunc"},
			{math_round, "round"},

			{math_mod, "mod"},
			{math_remainder, "remainder"},
			{math_nextafter, "nextafter"},

			{math_isfinite, "isfinite"},
			{math_isinf, "isinf"},
			{math_isnan, "isnan"},
			{math_isnormal, "isnormal"},
			{math_signbit, "signbit"},
	};
	return {scripts, handlers, nullptr};
}